

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall
QColorDialogPrivate::setCurrentColor
          (QColorDialogPrivate *this,QColor *color,SetColorMode setColorMode)

{
  QPlatformColorDialogHelper *pQVar1;
  uint in_EDX;
  undefined8 in_RSI;
  QColorDialogPrivate *in_RDI;
  QColor *in_stack_00000038;
  QColorDialogPrivate *in_stack_00000040;
  QRgb in_stack_ffffffffffffffdc;
  
  if (((in_RDI->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    if ((in_EDX & 1) != 0) {
      QColor::rgb();
      setCurrentRgbColor(in_RDI,in_stack_ffffffffffffffdc);
      QColor::alpha();
      setCurrentAlpha(in_RDI,in_stack_ffffffffffffffdc);
    }
    if ((in_EDX & 2) != 0) {
      selectColor(in_stack_00000040,in_stack_00000038);
    }
  }
  else {
    pQVar1 = platformColorDialogHelper((QColorDialogPrivate *)0x7399f3);
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,in_RSI);
  }
  return;
}

Assistant:

void QColorDialogPrivate::setCurrentColor(const QColor &color,  SetColorMode setColorMode)
{
    if (nativeDialogInUse) {
        platformColorDialogHelper()->setCurrentColor(color);
        return;
    }

    if (setColorMode & ShowColor) {
        setCurrentRgbColor(color.rgb());
        setCurrentAlpha(color.alpha());
    }
    if (setColorMode & SelectColor)
        selectColor(color);
}